

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O0

int XlearnCreateDataFromMat
              (real_t *data,index_t nrow,index_t ncol,real_t *label,index_t *field_map,
              DataHandle *out)

{
  value_type vVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  pointer pDVar4;
  reference pvVar5;
  long in_RCX;
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  long in_R8;
  undefined8 *in_R9;
  runtime_error *_except_;
  real_t value_3;
  int j_3;
  real_t norm_3;
  int i_3;
  real_t value_2;
  int j_2;
  real_t norm_2;
  int i_2;
  real_t value_1;
  int j_1;
  real_t norm_1;
  int i_1;
  real_t value;
  int j;
  real_t norm;
  int i;
  unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> source;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  value_type in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  uint local_80;
  float local_7c;
  uint local_78;
  undefined4 in_stack_ffffffffffffff90;
  uint uVar6;
  undefined4 in_stack_ffffffffffffff94;
  uint local_68;
  uint local_60;
  float local_5c;
  uint local_58;
  uint local_50;
  float local_4c;
  uint local_48;
  
  operator_new(0x68);
  xLearn::DMatrix::DMatrix((DMatrix *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90))
  ;
  std::unique_ptr<xLearn::DMatrix,std::default_delete<xLearn::DMatrix>>::
  unique_ptr<std::default_delete<xLearn::DMatrix>,void>
            ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             (pointer)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  if (in_RCX == 0) {
    pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                       ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
                        0x1bf080);
    pDVar4->has_label = false;
    if (in_R8 == 0) {
      for (local_48 = 0; local_48 < in_ESI; local_48 = local_48 + 1) {
        std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                  ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf0b9);
        xLearn::DMatrix::AddRow
                  ((DMatrix *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_4c = 0.0;
        for (local_50 = 0; local_50 < in_EDX; local_50 = local_50 + 1) {
          uVar6 = *(uint *)(in_RDI + (ulong)(local_50 + local_48 * in_EDX) * 4);
          std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                    ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf11a)
          ;
          xLearn::DMatrix::AddNode(_i_2,(index_t)norm_2,j_2,value_2,i_3);
          auVar3 = vfmadd213ss_fma(ZEXT416(uVar6),ZEXT416(uVar6),ZEXT416((uint)local_4c));
          local_4c = auVar3._0_4_;
        }
        in_stack_ffffffffffffff60 = 1.0 / local_4c;
        pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                           ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
                            0x1bf218);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pDVar4->norm,(long)(int)local_48);
        *pvVar5 = in_stack_ffffffffffffff60;
      }
    }
    else {
      for (local_58 = 0; local_58 < in_ESI; local_58 = local_58 + 1) {
        std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                  ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf26e);
        xLearn::DMatrix::AddRow
                  ((DMatrix *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_5c = 0.0;
        for (local_60 = 0; local_60 < in_EDX; local_60 = local_60 + 1) {
          uVar6 = *(uint *)(in_RDI + (ulong)(local_60 + local_58 * in_EDX) * 4);
          std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                    ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf2cf)
          ;
          xLearn::DMatrix::AddNode(_i_2,(index_t)norm_2,j_2,value_2,i_3);
          auVar3 = vfmadd213ss_fma(ZEXT416(uVar6),ZEXT416(uVar6),ZEXT416((uint)local_5c));
          local_5c = auVar3._0_4_;
        }
        pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                           ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
                            0x1bf34f);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pDVar4->norm,(long)(int)local_58);
        *pvVar5 = 1.0 / local_5c;
      }
    }
  }
  else {
    pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                       ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
                        0x1bf38e);
    pDVar4->has_label = true;
    if (in_R8 == 0) {
      for (local_68 = 0; local_68 < in_ESI; local_68 = local_68 + 1) {
        std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                  ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf3c7);
        xLearn::DMatrix::AddRow
                  ((DMatrix *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        in_stack_ffffffffffffff54 = 0.0;
        vVar1 = *(value_type *)(in_RCX + (long)(int)local_68 * 4);
        pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                           ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
                            0x1bf400);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pDVar4->Y,(long)(int)local_68);
        *pvVar5 = vVar1;
        for (uVar6 = 0; uVar6 < in_EDX; uVar6 = uVar6 + 1) {
          uVar2 = *(uint *)(in_RDI + (ulong)(uVar6 + local_68 * in_EDX) * 4);
          std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                    ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf464)
          ;
          xLearn::DMatrix::AddNode(_i_2,(index_t)norm_2,j_2,value_2,i_3);
          auVar3 = vfmadd213ss_fma(ZEXT416(uVar2),ZEXT416(uVar2),
                                   ZEXT416((uint)in_stack_ffffffffffffff54));
          in_stack_ffffffffffffff54 = auVar3._0_4_;
        }
        in_stack_ffffffffffffff54 = 1.0 / in_stack_ffffffffffffff54;
        pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                           ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
                            0x1bf4d8);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pDVar4->norm,(long)(int)local_68);
        *pvVar5 = in_stack_ffffffffffffff54;
      }
    }
    else {
      for (local_78 = 0; local_78 < in_ESI; local_78 = local_78 + 1) {
        std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                  ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf52e);
        xLearn::DMatrix::AddRow
                  ((DMatrix *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
        local_7c = 0.0;
        in_stack_ffffffffffffff50 = *(value_type *)(in_RCX + (long)(int)local_78 * 4);
        pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                           ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
                            0x1bf567);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pDVar4->Y,(long)(int)local_78);
        *pvVar5 = in_stack_ffffffffffffff50;
        for (local_80 = 0; local_80 < in_EDX; local_80 = local_80 + 1) {
          uVar6 = *(uint *)(in_RDI + (ulong)(local_80 + local_78 * in_EDX) * 4);
          std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                    ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf5cf)
          ;
          xLearn::DMatrix::AddNode(_i_2,(index_t)norm_2,j_2,value_2,i_3);
          auVar3 = vfmadd213ss_fma(ZEXT416(uVar6),ZEXT416(uVar6),ZEXT416((uint)local_7c));
          local_7c = auVar3._0_4_;
        }
        local_7c = 1.0 / local_7c;
        pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::operator->
                           ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
                            0x1bf64f);
        pvVar5 = std::vector<float,_std::allocator<float>_>::operator[]
                           (&pDVar4->norm,(long)(int)local_78);
        *pvVar5 = local_7c;
      }
    }
  }
  pDVar4 = std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::release
                     ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)0x1bf68b
                     );
  *in_R9 = pDVar4;
  std::unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_>::~unique_ptr
            ((unique_ptr<xLearn::DMatrix,_std::default_delete<xLearn::DMatrix>_> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  return 0;
}

Assistant:

XL_DLL int XlearnCreateDataFromMat(const real_t* data,
                                   index_t nrow,
                                   index_t ncol,
                                   const real_t* label,
                                   index_t* field_map,
                                   DataHandle* out) {
  API_BEGIN();
  std::unique_ptr<xLearn::DMatrix> source(new xLearn::DMatrix());	
  // if feature_map equal nullptr, we will not use field
  if (label == nullptr) {
    source->has_label = false;
    if (field_map == nullptr) {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    } else {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value, field_map[j]);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    }
  } else {
    source->has_label = true;
    if (field_map == nullptr) {
      for (int i = 0; i < nrow; ++i) {
        source->AddRow();
        real_t norm = 0.0;
        source->Y[i] = label[i];
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    } else {
      for (int i = 0; i < nrow; ++i) {	
        source->AddRow();
        real_t norm = 0.0;
        source->Y[i] = label[i];
        for (int j = 0; j < ncol; ++j) {
          real_t value = data[j+i*ncol];
          source->AddNode(i, j, value, field_map[j]);
          norm += value*value;
        }
        norm = 1.0f / norm;
        source->norm[i] = norm;
      }
    }
  }
  *out = source.release();
  API_END();
}